

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O3

void __thiscall
mjs::native_object::native_object(native_object *this,string *class_name,object_ptr *prototype)

{
  gc_heap *args_1;
  uint32_t local_18;
  
  object::object(&this->super_object,class_name,prototype);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_00251630;
  args_1 = (this->super_object).heap_;
  gc_heap::
  allocate_and_construct<mjs::gc_vector<mjs::native_object::native_object_property>,mjs::gc_heap&,unsigned_int&>
            ((gc_heap *)&stack0xffffffffffffffe0,(size_t)args_1,(gc_heap *)0x10,(uint *)args_1);
  (this->native_properties_).pos_ = local_18;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

native_object::native_object(const string& class_name, const object_ptr& prototype)
    : object(class_name, prototype)
    , native_properties_(gc_vector<native_object_property>::make(heap(), 16)) {
}